

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *test_00;
  int iVar1;
  int iVar2;
  char **argv_00;
  FILE *pFVar3;
  int err;
  FILE *fsuccess;
  char *pcStack_188;
  int arg_count;
  char *result;
  int new_count;
  int count;
  char **next;
  char *this_test;
  char **test;
  display d;
  char *touch_file;
  char *count_argv;
  int default_tests;
  int strict;
  png_uint_32 default_flags [4];
  FILE *fp;
  char **argv_local;
  int argc_local;
  
  count_argv._4_4_ = 0;
  count_argv._0_4_ = 0;
  touch_file = "default=save";
  d.test = (char *)0x0;
  init_display((display *)&test,*argv);
  fp = (FILE *)argv;
  argv_local._0_4_ = argc;
  while( true ) {
    argv_00 = &fp->_IO_read_ptr;
    iVar1 = (int)argv_local + -1;
    if (iVar1 < 1) break;
    iVar2 = strcmp(*argv_00,"--strict");
    if (iVar2 == 0) {
      count_argv._4_4_ = 1;
      fp = (FILE *)argv_00;
      argv_local._0_4_ = iVar1;
    }
    else {
      iVar2 = strcmp(*argv_00,"--default");
      if (iVar2 == 0) {
        count_argv._0_4_ = 1;
        fp = (FILE *)argv_00;
        argv_local._0_4_ = iVar1;
      }
      else {
        iVar2 = strcmp(*argv_00,"--touch");
        if (iVar2 != 0) break;
        if (iVar1 < 2) {
          usage((char *)d._240_8_,"--touch: missing file name");
        }
        d.test = fp->_IO_read_end;
        argv_local._0_4_ = (int)argv_local + -2;
        fp = (FILE *)&fp->_IO_read_end;
      }
    }
  }
  if (iVar1 < 1) {
    usage((char *)d._240_8_,"missing test file");
  }
  if (((int)count_argv != 0) && (iVar1 != 1)) {
    usage((char *)d._240_8_,"extra arguments");
  }
  iVar1 = (int)argv_local + -2;
  d.program = argv_00[iVar1];
  pFVar3 = fopen(d.program,"rb");
  if (pFVar3 == (FILE *)0x0) {
    perror(d.program);
    exit(99);
  }
  iVar2 = check((FILE *)pFVar3,1,&touch_file,(png_uint_32p)&default_tests,(display *)&test,0);
  if (iVar2 == 3) {
    if ((int)count_argv == 0) {
      d.file = "command line";
      perform_one_test((FILE *)pFVar3,iVar1,argv_00,(png_uint_32 *)&default_tests,(display *)&test,0
                      );
      perform_one_test((FILE *)pFVar3,iVar1,argv_00,(png_uint_32 *)&default_tests,(display *)&test,1
                      );
      d.file = "initialization";
    }
    else {
      this_test = (char *)standard_tests;
      while (*(long *)this_test != 0) {
        test_00 = *(char **)this_test;
        iVar1 = display_rc((display *)&test,count_argv._4_4_);
        fsuccess._4_4_ = 0;
        for (_new_count = (char **)(this_test + 8); *_new_count != (char *)0x0;
            _new_count = _new_count + 1) {
          fsuccess._4_4_ = fsuccess._4_4_ + 1;
        }
        perform_one_test_safe
                  ((FILE *)pFVar3,fsuccess._4_4_,(char **)(this_test + 8),
                   (png_uint_32 *)&default_tests,(display *)&test,test_00);
        iVar2 = display_rc((display *)&test,count_argv._4_4_);
        if (iVar2 == iVar1) {
          pcStack_188 = "PASS";
        }
        else {
          pcStack_188 = "FAIL";
        }
        printf("%s: %s %s\n",pcStack_188,d._240_8_,test_00);
        this_test = (char *)(_new_count + 1);
      }
    }
    fclose(pFVar3);
    iVar1 = display_rc((display *)&test,count_argv._4_4_);
    if (iVar1 == 0) {
      if (d.test != (char *)0x0) {
        pFVar3 = fopen(d.test,"wt");
        if (pFVar3 == (FILE *)0x0) {
          fprintf(_stderr,"%s: open failed\n",d.test);
          exit(99);
        }
        fprintf(pFVar3,"PNG unknown tests succeeded\n");
        fflush(pFVar3);
        iVar1 = ferror(pFVar3);
        iVar2 = fclose(pFVar3);
        if ((iVar2 != 0) || (iVar1 != 0)) {
          fprintf(_stderr,"%s: write failed\n",d.test);
          exit(99);
        }
      }
      argv_local._4_4_ = 0;
    }
    else {
      argv_local._4_4_ = 1;
    }
    return argv_local._4_4_;
  }
  fprintf(_stderr,"%s: %s: internal error\n",d._240_8_,d.program);
  exit(99);
}

Assistant:

int
main(int argc, const char **argv)
{
   FILE *fp;
   png_uint_32 default_flags[4]; /*valid,unknown{before,after}*/
   int strict = 0, default_tests = 0;
   const char *count_argv = "default=save";
   const char *touch_file = NULL;
   display d;

   init_display(&d, argv[0]);

   while (++argv, --argc > 0)
   {
      if (strcmp(*argv, "--strict") == 0)
         strict = 1;

      else if (strcmp(*argv, "--default") == 0)
         default_tests = 1;

      else if (strcmp(*argv, "--touch") == 0)
      {
         if (argc > 1)
            touch_file = *++argv, --argc;

         else
            usage(d.program, "--touch: missing file name");
      }

      else
         break;
   }

   /* A file name is required, but there should be no other arguments if
    * --default was specified.
    */
   if (argc <= 0)
      usage(d.program, "missing test file");

   /* GCC BUG: if (default_tests && argc != 1) triggers some weird GCC argc
    * optimization which causes warnings with -Wstrict-overflow!
    */
   else if (default_tests)
      if (argc != 1)
         usage(d.program, "extra arguments");

   /* The name of the test file is the last argument; remove it. */
   d.file = argv[--argc];

   fp = fopen(d.file, "rb");
   if (fp == NULL)
   {
      perror(d.file);
      exit(99);
   }

   /* First find all the chunks, known and unknown, in the test file, a failure
    * here aborts the whole test.
    *
    * If 'save' is supported then the normal saving method should happen,
    * otherwise if 'read' is supported then the read callback will do the
    * same thing.  If both are supported the 'read' callback won't be
    * instantiated by default.  If 'save' is *not* supported then a user
    * callback is required even though we can call png_get_unknown_chunks.
    */
   if (check(fp, 1, &count_argv, default_flags, &d,
#     ifdef PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED
         0
#     else
         1
#     endif
      ) != PNG_HANDLE_CHUNK_ALWAYS)
   {
      fprintf(stderr, "%s: %s: internal error\n", d.program, d.file);
      exit(99);
   }

   /* Now find what the various supplied options cause to change: */
   if (!default_tests)
   {
      d.test = cmd; /* acts as a flag to say exit, do not longjmp */
#     ifdef PNG_SAVE_UNKNOWN_CHUNKS_SUPPORTED
         perform_one_test(fp, argc, argv, default_flags, &d, 0);
#     endif
#     ifdef PNG_READ_USER_CHUNKS_SUPPORTED
         perform_one_test(fp, argc, argv, default_flags, &d, 1);
#     endif
      d.test = init;
   }

   else
   {
      const char **test = standard_tests;

      /* Set the exit_test pointer here so we can continue after a libpng error.
       * NOTE: this leaks memory because the png_struct data from the failing
       * test is never freed.
       */
      while (*test)
      {
         const char *this_test = *test++;
         const char **next = test;
         int count = display_rc(&d, strict), new_count;
         const char *result;
         int arg_count = 0;

         while (*next != NULL)
         {
            ++next;
            ++arg_count;
         }

         perform_one_test_safe(fp, arg_count, test, default_flags, &d,
            this_test);

         new_count = display_rc(&d, strict);

         if (new_count == count)
            result = "PASS";

         else
            result = "FAIL";

         printf("%s: %s %s\n", result, d.program, this_test);

         test = next+1;
      }
   }

   fclose(fp);

   if (display_rc(&d, strict) == 0)
   {
      /* Success, touch the success file if appropriate */
      if (touch_file != NULL)
      {
         FILE *fsuccess = fopen(touch_file, "wt");

         if (fsuccess != NULL)
         {
            int err = 0;
            fprintf(fsuccess, "PNG unknown tests succeeded\n");
            fflush(fsuccess);
            err = ferror(fsuccess);

            if (fclose(fsuccess) || err)
            {
               fprintf(stderr, "%s: write failed\n", touch_file);
               exit(99);
            }
         }

         else
         {
            fprintf(stderr, "%s: open failed\n", touch_file);
            exit(99);
         }
      }

      return 0;
   }

   return 1;
}